

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSimSat.c
# Opt level: O0

void Dch_ManResimulateCex2(Dch_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pRepr)

{
  Aig_Man_t *p_00;
  int iVar1;
  abctime aVar2;
  Aig_Obj_t *pAVar3;
  abctime aVar4;
  abctime clk;
  int RetValue;
  int i;
  Aig_Obj_t *pRoot;
  Aig_Obj_t *pRepr_local;
  Aig_Obj_t *pObj_local;
  Dch_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  iVar1 = Dch_ObjIsConst1Cand(p->pAigTotal,pObj);
  if (iVar1 == 0) {
    Dch_ClassesCollectOneClass(p->ppClasses,pRepr,p->vSimRoots);
  }
  else {
    Dch_ClassesCollectConst1Group(p->ppClasses,pObj,500,p->vSimRoots);
  }
  p->nConeThis = 0;
  Aig_ManIncrementTravId(p->pAigTotal);
  p_00 = p->pAigTotal;
  pAVar3 = Aig_ManConst1(p->pAigTotal);
  Aig_ObjSetTravIdCurrent(p_00,pAVar3);
  Dch_ManResimulateSolved_rec(p,pObj);
  Dch_ManResimulateSolved_rec(p,pRepr);
  iVar1 = Abc_MaxInt(p->nConeMax,p->nConeThis);
  p->nConeMax = iVar1;
  for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p->vSimRoots), clk._4_4_ < iVar1;
      clk._4_4_ = clk._4_4_ + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vSimRoots,clk._4_4_);
    Dch_ManResimulateOther_rec(p,pAVar3);
  }
  iVar1 = Dch_ObjIsConst1Cand(p->pAigTotal,pObj);
  if (iVar1 == 0) {
    clk._0_4_ = Dch_ClassesRefineOneClass(p->ppClasses,pRepr,0);
  }
  else {
    clk._0_4_ = Dch_ClassesRefineConst1Group(p->ppClasses,p->vSimRoots,0);
  }
  if ((int)clk == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchSimSat.c"
                  ,0xfa,"void Dch_ManResimulateCex2(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  aVar4 = Abc_Clock();
  p->timeSimSat = (aVar4 - aVar2) + p->timeSimSat;
  return;
}

Assistant:

void Dch_ManResimulateCex2( Dch_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pRoot;
    int i, RetValue;
    abctime clk = Abc_Clock();
    // get the equivalence class
    if ( Dch_ObjIsConst1Cand(p->pAigTotal, pObj) )
        Dch_ClassesCollectConst1Group( p->ppClasses, pObj, 500, p->vSimRoots );
    else
        Dch_ClassesCollectOneClass( p->ppClasses, pRepr, p->vSimRoots );
    // resimulate the cone of influence of the solved nodes
    p->nConeThis = 0;
    Aig_ManIncrementTravId( p->pAigTotal );
    Aig_ObjSetTravIdCurrent( p->pAigTotal, Aig_ManConst1(p->pAigTotal) );
    Dch_ManResimulateSolved_rec( p, pObj );
    Dch_ManResimulateSolved_rec( p, pRepr );
    p->nConeMax = Abc_MaxInt( p->nConeMax, p->nConeThis );
    // resimulate the cone of influence of the other nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vSimRoots, pRoot, i )
        Dch_ManResimulateOther_rec( p, pRoot );
    // refine this class
    if ( Dch_ObjIsConst1Cand(p->pAigTotal, pObj) )
        RetValue = Dch_ClassesRefineConst1Group( p->ppClasses, p->vSimRoots, 0 );
    else
        RetValue = Dch_ClassesRefineOneClass( p->ppClasses, pRepr, 0 );
    assert( RetValue );
p->timeSimSat += Abc_Clock() - clk;
}